

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O0

DecodeResult * bech32::Decode(string *str,CharLimit limit)

{
  value_type vVar1;
  bool bVar2;
  uchar uVar3;
  size_type sVar4;
  size_type sVar5;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  byte *pbVar6;
  reference pvVar7;
  ulong in_RDX;
  DecodeResult *in_RDI;
  long in_FS_OFFSET;
  Encoding result;
  size_t i_1;
  int8_t rev;
  uchar c;
  size_t i;
  size_t pos;
  data values;
  vector<int,_std::allocator<int>_> errors;
  string hrp;
  undefined7 in_stack_fffffffffffffe98;
  uchar in_stack_fffffffffffffe9f;
  undefined7 in_stack_fffffffffffffea0;
  char in_stack_fffffffffffffea7;
  undefined4 in_stack_fffffffffffffea8;
  Encoding in_stack_fffffffffffffeac;
  Encoding EVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  DecodeResult *this;
  undefined4 in_stack_fffffffffffffec0;
  Encoding EVar9;
  undefined4 in_stack_fffffffffffffec4;
  string *in_stack_fffffffffffffec8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  ulong local_d0;
  ulong local_c0;
  undefined1 local_81 [40];
  string local_59;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  bVar2 = anon_unknown_0::CheckCharacters
                    (in_stack_fffffffffffffec8,
                     (vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  if (bVar2) {
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                      (in_stack_fffffffffffffeb8,(char)((ulong)in_stack_fffffffffffffec8 >> 0x38),
                       (size_type)in_stack_fffffffffffffeb0);
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    if (in_RDX < sVar5) {
      DecodeResult::DecodeResult
                ((DecodeResult *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    }
    else {
      if ((sVar4 != 0xffffffffffffffff) && (sVar4 != 0)) {
        sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
        if (sVar4 + 6 < sVar5) {
          sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
          __last._M_current = (uchar *)(~sVar4 + sVar5);
          __first._M_current = (uchar *)&local_59;
          std::allocator<unsigned_char>::allocator
                    ((allocator<unsigned_char> *)
                     CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffec8,
                     CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     (allocator_type *)in_stack_fffffffffffffeb8);
          std::allocator<unsigned_char>::~allocator
                    ((allocator<unsigned_char> *)
                     CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
          local_c0 = 0;
          while( true ) {
            sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
            if ((sVar5 - 1) - sVar4 <= local_c0) break;
            pbVar6 = (byte *)std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                             operator[](in_stack_fffffffffffffeb8,
                                        (size_type)in_stack_fffffffffffffeb0);
            vVar1 = (anonymous_namespace)::CHARSET_REV[*pbVar6];
            if (vVar1 == 0xff) {
              DecodeResult::DecodeResult
                        ((DecodeResult *)
                         CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
              goto LAB_0034ee29;
            }
            pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                                CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
            *pvVar7 = vVar1;
            local_c0 = local_c0 + 1;
          }
          this_00 = &local_28;
          std::__cxx11::string::string(in_stack_fffffffffffffeb0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     (size_type)this_00);
          EVar8 = in_stack_fffffffffffffeac;
          for (local_d0 = 0; local_d0 < sVar4; local_d0 = local_d0 + 1) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator[](in_stack_fffffffffffffeb8,(size_type)in_stack_fffffffffffffeb0);
            uVar3 = anon_unknown_0::LowerCase(in_stack_fffffffffffffe9f);
            in_stack_fffffffffffffec4 = CONCAT13(uVar3,(int3)in_stack_fffffffffffffec4);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(EVar8,in_stack_fffffffffffffea8),in_stack_fffffffffffffea7);
          }
          in_stack_fffffffffffffeac =
               anon_unknown_0::VerifyChecksum
                         ((string *)__first._M_current,(data *)__last._M_current);
          if (in_stack_fffffffffffffeac == INVALID) {
            DecodeResult::DecodeResult
                      ((DecodeResult *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98)
                      );
            in_stack_fffffffffffffeac = EVar8;
          }
          else {
            EVar8 = (Encoding)((ulong)((long)&local_59._M_dataplus._M_p + 1) >> 0x20);
            EVar9 = in_stack_fffffffffffffeac;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
            local_81._1_8_ =
                 std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
            __gnu_cxx::
            __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::operator-((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                        CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
            this = (DecodeResult *)local_81;
            std::allocator<unsigned_char>::allocator
                      ((allocator<unsigned_char> *)
                       CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                      (this_00,__first,__last,
                       (allocator_type *)CONCAT44(in_stack_fffffffffffffec4,EVar9));
            DecodeResult::DecodeResult
                      (this,EVar8,
                       (string *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
            std::allocator<unsigned_char>::~allocator
                      ((allocator<unsigned_char> *)
                       CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
          }
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
LAB_0034ee29:
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
          goto LAB_0034ee47;
        }
      }
      DecodeResult::DecodeResult
                ((DecodeResult *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    }
  }
  else {
    DecodeResult::DecodeResult
              ((DecodeResult *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  }
LAB_0034ee47:
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

DecodeResult Decode(const std::string& str, CharLimit limit) {
    std::vector<int> errors;
    if (!CheckCharacters(str, errors)) return {};
    size_t pos = str.rfind('1');
    if (str.size() > limit) return {};
    if (pos == str.npos || pos == 0 || pos + CHECKSUM_SIZE >= str.size()) {
        return {};
    }
    data values(str.size() - 1 - pos);
    for (size_t i = 0; i < str.size() - 1 - pos; ++i) {
        unsigned char c = str[i + pos + 1];
        int8_t rev = CHARSET_REV[c];

        if (rev == -1) {
            return {};
        }
        values[i] = rev;
    }
    std::string hrp;
    hrp.reserve(pos);
    for (size_t i = 0; i < pos; ++i) {
        hrp += LowerCase(str[i]);
    }
    Encoding result = VerifyChecksum(hrp, values);
    if (result == Encoding::INVALID) return {};
    return {result, std::move(hrp), data(values.begin(), values.end() - CHECKSUM_SIZE)};
}